

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBlending::prepareFramebuffer(DrawBuffersIndexedBlending *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ResourceError *this_00;
  size_type __n;
  reference pvVar4;
  int local_78;
  allocator<unsigned_int> local_71;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufs;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  long lStack_18;
  GLint maxDrawBuffers;
  Functions *gl;
  DrawBuffersIndexedBlending *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  (**(code **)(lStack_18 + 0x868))(0x8824,&local_1c);
  if (local_1c < 4) {
    bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Minimum number of draw buffers too low",&local_41);
    tcu::ResourceError::ResourceError(this_00,&local_40);
    bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  (**(code **)(lStack_18 + 0x6d0))(1,&this->m_fbo);
  (**(code **)(lStack_18 + 0x78))(0x8d40,this->m_fbo);
  __n = (size_type)local_1c;
  std::allocator<unsigned_int>::allocator(&local_71);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,__n,&local_71);
  std::allocator<unsigned_int>::~allocator(&local_71);
  for (local_78 = 0; iVar2 = local_1c, local_78 < local_1c; local_78 = local_78 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)local_78);
    *pvVar4 = local_78 + 0x8ce0;
  }
  pcVar1 = *(code **)(lStack_18 + 0x560);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
  (*pcVar1)(iVar2,pvVar4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return;
}

Assistant:

void DrawBuffersIndexedBlending::prepareFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		throw tcu::ResourceError("Minimum number of draw buffers too low");
	}

	gl.genFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

	std::vector<glw::GLenum> bufs(maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		bufs[i] = GL_COLOR_ATTACHMENT0 + i;
	}
	gl.drawBuffers(maxDrawBuffers, &bufs[0]);
}